

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

bool __thiscall QResourceFileEnginePrivate::mapUncompressed_sys(QResourceFileEnginePrivate *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  void *__addr;
  QByteArray *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  char *newdata;
  void *ptr;
  R_conflict3 r;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QResource *in_stack_ffffffffffffff90;
  QResource *in_stack_ffffffffffffffa8;
  char *data;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  QResource::data(in_stack_ffffffffffffff90);
  QResource::uncompressedSize(in_stack_ffffffffffffff90);
  mappingBoundaries((void *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                    (qsizetype)data);
  bVar2 = QResourcePrivate::mayRemapData(in_stack_ffffffffffffffa8);
  if (bVar2) {
    __addr = mremap(&DAT_aaaaaaaaaaaaaaaa,0xaaaaaaaaaaaaaaaa,0xaaaaaaaaaaaaaaaa,5);
    if (__addr == (void *)0xffffffffffffffff) {
      bVar2 = false;
    }
    else {
      iVar3 = mprotect(__addr,0xaaaaaaaaaaaaaaaa,3);
      if (iVar3 == 0) {
        if (__addr == (void *)0x0) {
          bVar2 = false;
        }
        else {
          this_00 = (QByteArray *)((long)__addr + -0x5555555555555556);
          QResource::uncompressedSize((QResource *)this_00);
          QByteArray::fromRawData(data,(qsizetype)__addr);
          QByteArray::operator=
                    (this_00,(QByteArray *)
                             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          QByteArray::~QByteArray((QByteArray *)0x2ead88);
          in_RDI[0x58] = '\x01';
          bVar2 = true;
        }
      }
      else {
        munmap(__addr,0xaaaaaaaaaaaaaaaa);
        bVar2 = false;
      }
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QResourceFileEnginePrivate::mapUncompressed_sys()
{
    auto r = mappingBoundaries(resource.data(), resource.uncompressedSize());
    void *ptr = nullptr;

#if defined(MREMAP_MAYMOVE) && defined(MREMAP_DONTUNMAP)
    // Use MREMAP_MAYMOVE to tell the kernel to give us a new address and use
    // MREMAP_DONTUNMAP (supported since kernel 5.7) to request that it create
    // a new mapping of the same pages, instead of moving. We can only do that
    // for pages that are read-only, otherwise the kernel replaces the source
    // with pages full of nulls.
    if (!QResourcePrivate::mayRemapData(resource))
        return false;

    ptr = mremap(r.begin, r.size, r.size, MREMAP_MAYMOVE | MREMAP_DONTUNMAP);
    if (ptr == MAP_FAILED)
        return false;

    // Allow writing, which the documentation says we allow. This is safe
    // because MREMAP_DONTUNMAP only works for private mappings.
    if (mprotect(ptr, r.size, PROT_READ | PROT_WRITE) != 0) {
        munmap(ptr, r.size);
        return false;
    }
#elif defined(Q_OS_DARWIN)
    mach_port_t self = mach_task_self();
    vm_address_t addr = 0;
    vm_address_t mask = 0;
    bool anywhere = true;
    bool copy = true;
    vm_prot_t cur_prot = VM_PROT_READ | VM_PROT_WRITE;
    vm_prot_t max_prot = VM_PROT_ALL;
    kern_return_t res = vm_remap(self, &addr, r.size, mask, anywhere,
                                 self, vm_address_t(r.begin), copy, &cur_prot,
                                 &max_prot, VM_INHERIT_DEFAULT);
    if (res != KERN_SUCCESS)
        return false;

    ptr = reinterpret_cast<void *>(addr);
    if ((max_prot & VM_PROT_WRITE) == 0 || mprotect(ptr, r.size, PROT_READ | PROT_WRITE) != 0) {
        munmap(ptr, r.size);
        return false;
    }
#endif

    if (!ptr)
        return false;
    const char *newdata = static_cast<char *>(ptr) + r.offset;
    uncompressed = QByteArray::fromRawData(newdata, resource.uncompressedSize());
    mustUnmap = true;
    return true;
}